

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_float16.cpp
# Opt level: O2

float duckdb::Float16ToFloat32(uint16_t *float16_value)

{
  ushort uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *float16_value;
  uVar4 = (uint)(uVar1 >> 0xf);
  uVar5 = uVar1 >> 10 & 0x1f;
  if (uVar5 == 0x1f) {
    fVar3 = (float)((uint)uVar1 << 0xd | uVar4 << 0x1f | 0x7f800000);
  }
  else {
    uVar2 = uVar1 & 0x3ff;
    if ((uVar1 >> 10 & 0x1f) == 0) {
      if ((uVar1 & 0x3ff) == 0) {
        fVar3 = (float)(uVar4 << 0x1f);
      }
      else {
        uVar5 = 0x38800000;
        for (; (uVar2 >> 10 & 1) == 0; uVar2 = uVar2 * 2) {
          uVar5 = uVar5 - 0x800000;
        }
        fVar3 = (float)((uVar2 & 0x3ff) << 0xd | uVar5 | uVar4 << 0x1f);
      }
    }
    else {
      fVar3 = (float)(uVar2 * 0x2000 + (uVar5 << 0x17 | uVar4 << 0x1f) + 0x38000000);
    }
  }
  return fVar3;
}

Assistant:

float Float16ToFloat32(const uint16_t &float16_value) {
	uint32_t sign = float16_value >> 15;
	uint32_t exponent = (float16_value >> 10) & 0x1F;
	uint32_t fraction = (float16_value & 0x3FF);
	uint32_t float32_value;
	if (exponent == 0) {
		if (fraction == 0) {
			// zero
			float32_value = (sign << 31);
		} else {
			// can be represented as ordinary value in float32
			// 2 ** -14 * 0.0101
			// => 2 ** -16 * 1.0100
			// int int_exponent = -14;
			exponent = 127 - 14;
			while ((fraction & (1 << 10)) == 0) {
				// int_exponent--;
				exponent--;
				fraction <<= 1;
			}
			fraction &= 0x3FF;
			// int_exponent += 127;
			float32_value = (sign << 31) | (exponent << 23) | (fraction << 13);
		}
	} else if (exponent == 0x1F) {
		/* Inf or NaN */
		float32_value = (sign << 31) | (0xFF << 23) | (fraction << 13);
	} else {
		/* ordinary number */
		float32_value = (sign << 31) | ((exponent + (127 - 15)) << 23) | (fraction << 13);
	}

	return *reinterpret_cast<float *>(&float32_value);
}